

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.h
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::ConvertToNinjaAbsPath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalNinjaGenerator *this_00;
  string local_38;
  
  this_00 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  local_38._M_dataplus._M_p = (path->_M_dataplus)._M_p;
  paVar1 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar1) {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_38.field_2._8_8_ = *(undefined8 *)((long)&path->field_2 + 8);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38._M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar1;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  cmGlobalNinjaGenerator::ConvertToNinjaAbsPath(__return_storage_ptr__,this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertToNinjaAbsPath(std::string path) const
  {
    return this->GetGlobalGenerator()->ConvertToNinjaAbsPath(std::move(path));
  }